

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb_asnmth.c
# Opt level: O0

int ENGINE_register_pkey_asn1_meths(ENGINE *e)

{
  int iVar1;
  int in_stack_00000008;
  int num_nids;
  int *nids;
  ENGINE *in_stack_00000018;
  undefined1 *in_stack_00000020;
  ENGINE_TABLE **in_stack_00000028;
  undefined1 local_18 [8];
  ENGINE *local_10;
  int local_4;
  
  if ((*(long *)(e + 0x50) == 0) ||
     (local_10 = e, iVar1 = (**(code **)(e + 0x50))(e,0,local_18,0), iVar1 < 1)) {
    local_4 = 1;
  }
  else {
    local_4 = engine_table_register
                        (in_stack_00000028,in_stack_00000020,in_stack_00000018,nids,num_nids,
                         in_stack_00000008);
  }
  return local_4;
}

Assistant:

int ENGINE_register_pkey_asn1_meths(ENGINE *e)
{
    if (e->pkey_asn1_meths) {
        const int *nids;
        int num_nids = e->pkey_asn1_meths(e, NULL, &nids, 0);
        if (num_nids > 0)
            return engine_table_register(&pkey_asn1_meth_table,
                                         engine_unregister_all_pkey_asn1_meths,
                                         e, nids, num_nids, 0);
    }
    return 1;
}